

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_type_handler.h
# Opt level: O1

uint8_t * google::protobuf::internal::
          MapEntryFuncs<int,_google::protobuf::Empty,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
          ::InternalSerialize(int field_number,int *key,Empty *value,uint8_t *ptr,
                             EpsCopyOutputStream *stream)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  byte *pbVar5;
  uint8_t *puVar6;
  byte *pbVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  
  if (stream->end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
  }
  uVar4 = (ulong)(field_number * 8 + 2);
  if (0x7f < (uint)(field_number << 3)) {
    do {
      uVar8 = (uint)uVar4;
      *ptr = (byte)uVar4 | 0x80;
      uVar4 = uVar4 >> 7;
      ptr = ptr + 1;
    } while (0x3fff < uVar8);
  }
  *ptr = (byte)uVar4;
  pbVar7 = ptr + 1;
  lVar3 = 0x3f;
  if (((long)*key | 1U) != 0) {
    for (; ((long)*key | 1U) >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  uVar8 = (value->super_ZeroFieldsBase)._impl_._cached_size_.atom_;
  uVar10 = uVar8 | 1;
  iVar2 = 0x1f;
  if (uVar10 != 0) {
    for (; uVar10 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  uVar10 = ((int)lVar3 * 9 + 0x49U >> 6) + (iVar2 * 9 + 0x49U >> 6) + uVar8 + 2;
  uVar8 = uVar10;
  if (0x7f < uVar10) {
    do {
      *pbVar7 = (byte)uVar8 | 0x80;
      uVar10 = uVar8 >> 7;
      pbVar7 = pbVar7 + 1;
      bVar1 = 0x3fff < uVar8;
      uVar8 = uVar10;
    } while (bVar1);
  }
  *pbVar7 = (byte)uVar10;
  pbVar7 = pbVar7 + 1;
  if (stream->end_ <= pbVar7) {
    pbVar7 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar7);
  }
  uVar9 = (ulong)*key;
  pbVar5 = pbVar7 + 1;
  *pbVar7 = 8;
  uVar4 = uVar9;
  if (0x7f < uVar9) {
    do {
      *pbVar5 = (byte)uVar4 | 0x80;
      uVar9 = uVar4 >> 7;
      pbVar5 = pbVar5 + 1;
      bVar1 = 0x3fff < uVar4;
      uVar4 = uVar9;
    } while (bVar1);
  }
  *pbVar5 = (byte)uVar9;
  pbVar5 = pbVar5 + 1;
  if (stream->end_ <= pbVar5) {
    pbVar5 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar5);
  }
  puVar6 = WireFormatLite::InternalWriteMessage
                     (2,(MessageLite *)value,
                      (value->super_ZeroFieldsBase)._impl_._cached_size_.atom_,pbVar5,stream);
  return puVar6;
}

Assistant:

static uint8_t* InternalSerialize(int field_number, const Key& key,
                                    const Value& value, uint8_t* ptr,
                                    io::EpsCopyOutputStream* stream) {
    ptr = stream->EnsureSpace(ptr);
    ptr = WireFormatLite::WriteTagToArray(
        field_number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED, ptr);
    ptr = io::CodedOutputStream::WriteVarint32ToArray(GetCachedSize(key, value),
                                                      ptr);

    ptr = KeyTypeHandler::Write(kKeyFieldNumber, key, ptr, stream);
    return ValueTypeHandler::Write(kValueFieldNumber, value, ptr, stream);
  }